

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_ast_delete(mpc_ast_t *a)

{
  undefined8 *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != (undefined8 *)0x0) {
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 6); iVar1 = iVar1 + 1) {
      mpc_ast_delete((mpc_ast_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
    free((void *)in_RDI[7]);
    free((void *)*in_RDI);
    free((void *)in_RDI[1]);
    free(in_RDI);
  }
  return;
}

Assistant:

void mpc_ast_delete(mpc_ast_t *a) {

  int i;

  if (a == NULL) { return; }

  for (i = 0; i < a->children_num; i++) {
    mpc_ast_delete(a->children[i]);
  }

  free(a->children);
  free(a->tag);
  free(a->contents);
  free(a);

}